

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool redit_show(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  flag_type *flag_table;
  long in_RDI;
  __type_conflict2 _Var7;
  int end_2;
  int length;
  int i;
  char *state;
  char reset_state [4608];
  char word [4608];
  EXIT_DATA *pexit;
  EXTRA_DESCR_DATA *ed;
  int end_1;
  int end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  bool fcnt;
  int door;
  CHAR_DATA *rch;
  OBJ_DATA *obj;
  char buf1 [9216];
  char buf [4608];
  ROOM_INDEX_DATA *pRoom;
  char *in_stack_ffffffffffffa4a8;
  flag_type *in_stack_ffffffffffffa4b0;
  CHAR_DATA *in_stack_ffffffffffffa4b8;
  int in_stack_ffffffffffffa4c0;
  uint in_stack_ffffffffffffa4c4;
  long *in_stack_ffffffffffffa4c8;
  char **ppcVar8;
  flag_type *in_stack_ffffffffffffa4d0;
  char *local_5af0;
  char *local_5ae8;
  undefined4 in_stack_ffffffffffffa550;
  char **args;
  undefined4 in_stack_ffffffffffffa560;
  undefined4 in_stack_ffffffffffffa564;
  int local_5a94;
  char **in_stack_ffffffffffffa5d0;
  char **in_stack_ffffffffffffa5d8;
  char local_4888 [4616];
  long *local_3680;
  undefined8 *local_3678;
  int local_3670;
  int local_366c;
  undefined1 local_3668 [24];
  string local_3650 [35];
  char local_362d;
  int local_362c;
  long local_3628;
  long local_3620;
  char local_3618 [9216];
  char *local_1218 [576];
  long local_18;
  
  local_18 = *(long *)(in_RDI + 0xa8);
  local_3618[0] = '\0';
  sprintf((char *)local_1218,"Description:\n\r%s",*(undefined8 *)(local_18 + 0x120));
  strcat(local_3618,(char *)local_1218);
  if (*(long *)(local_18 + 0x128) == 0) {
    strcat(local_3618,"Alt Desc:   [None]\n\r");
  }
  else {
    sprintf((char *)local_1218,
            "Alt Desc:\n\r%sAlternate Room Title is %s.\n\rDescription is %s.\n\r",
            *(undefined8 *)(local_18 + 0x128),*(undefined8 *)(local_18 + 0x118),
            altdesc_condtable[*(short *)(local_18 + 0x138)].display);
    strcat(local_3618,(char *)local_1218);
  }
  sprintf((char *)local_1218,"Name:       [%s]\n\rArea:       [%5d] %s\n\r",
          *(undefined8 *)(local_18 + 0x110),(ulong)*(uint *)(*(long *)(local_18 + 0x30) + 0x168),
          *(undefined8 *)(*(long *)(local_18 + 0x30) + 0x40));
  strcat(local_3618,(char *)local_1218);
  ppcVar8 = local_1218;
  uVar3 = (uint)*(short *)(local_18 + 0x13a);
  pcVar4 = flag_string_old(in_stack_ffffffffffffa4b0,(int)((ulong)in_stack_ffffffffffffa4a8 >> 0x20)
                          );
  sprintf((char *)ppcVar8,"Vnum:       [%5d]\n\rSector:     [%s]\n\r",(ulong)uVar3,pcVar4);
  strcat(local_3618,(char *)local_1218);
  sprintf((char *)local_1218,"Cabal:      [%s]\n\r",cabal_table[*(short *)(local_18 + 0x156)].name);
  strcat(local_3618,(char *)local_1218);
  args = local_1218;
  if (*(long *)(local_18 + 0x130) == 0) {
    pcVar4 = "None";
  }
  else {
    pcVar4 = *(char **)(local_18 + 0x130);
  }
  sprintf((char *)args,"Owner:      [%s]\n\r",pcVar4);
  strcat(local_3618,(char *)local_1218);
  pcVar5 = flag_string(in_stack_ffffffffffffa4d0,in_stack_ffffffffffffa4c8);
  sprintf((char *)local_1218,"Room flags: [%s]\n\r",pcVar5);
  strcat(local_3618,(char *)local_1218);
  sprintf((char *)local_1218,"Health recovery:[%d]\n\rMana recovery  :[%d]\n\r",
          (ulong)(uint)(int)*(short *)(local_18 + 0x152),
          (ulong)(uint)(int)*(short *)(local_18 + 0x154));
  strcat(local_3618,(char *)local_1218);
  strcat(local_3618,"Trap:");
  if (*(long *)(local_18 + 0x198) == 0) {
    strcat(local_3618,"       [None]\n\r");
  }
  else {
    local_3668._16_8_ = flag_name_lookup((long)in_stack_ffffffffffffa4b8,in_stack_ffffffffffffa4b0);
    if (*(long *)(*(long *)(local_18 + 0x198) + 0x18) == 0) {
      local_5ae8 = "None";
    }
    else {
      local_5ae8 = *(char **)(*(long *)(local_18 + 0x198) + 0x18);
    }
    local_3668._8_8_ = local_5ae8;
    if (*(long *)(*(long *)(local_18 + 0x198) + 0x20) == 0) {
      local_5af0 = "None";
    }
    else {
      local_5af0 = *(char **)(*(long *)(local_18 + 0x198) + 0x20);
    }
    local_3668._0_8_ = local_5af0;
    in_stack_ffffffffffffa4a8 = local_3668 + 8;
    in_stack_ffffffffffffa4b0 = (flag_type *)local_3668;
    fmt::v9::sprintf<char[145],char*,int,int,int,char_const*,char_const*,char>
              ((char (*) [145])CONCAT44(in_stack_ffffffffffffa564,in_stack_ffffffffffffa560),args,
               (int *)CONCAT44(uVar3,in_stack_ffffffffffffa550),(int *)ppcVar8,(int *)pcVar4,
               in_stack_ffffffffffffa5d0,in_stack_ffffffffffffa5d8);
    pcVar4 = (char *)std::__cxx11::string::data();
    strcat(local_3618,pcVar4);
    std::__cxx11::string::~string(local_3650);
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
               in_stack_ffffffffffffa4b8);
  local_3618[0] = '\0';
  bVar2 = IS_ZERO_VECTOR((long *)(local_18 + 0x180));
  if (!bVar2) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
                 in_stack_ffffffffffffa4b8);
    uVar1 = *(ulong *)(local_18 + 0x180);
    _Var7 = std::pow<int,int>(0,0x77d978);
    if ((uVar1 & (long)_Var7) != 0) {
      sprintf((char *)local_1218," [pulse_prog] %s\n\r",
              *(undefined8 *)(*(long *)(local_18 + 0x178) + 0x30));
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
                   in_stack_ffffffffffffa4b8);
    }
    uVar1 = *(ulong *)(local_18 + 0x180);
    _Var7 = std::pow<int,int>(0,0x77d9ec);
    if ((uVar1 & (long)_Var7) != 0) {
      sprintf((char *)local_1218," [entry_prog] %s\n\r",
              *(undefined8 *)(*(long *)(local_18 + 0x178) + 0x38));
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
                   in_stack_ffffffffffffa4b8);
    }
    uVar1 = *(ulong *)(local_18 + 0x180);
    _Var7 = std::pow<int,int>(0,0x77da5d);
    if ((uVar1 & (long)_Var7) != 0) {
      sprintf((char *)local_1218," [move_prog] %s\n\r",
              *(undefined8 *)(*(long *)(local_18 + 0x178) + 0x40));
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
                   in_stack_ffffffffffffa4b8);
    }
    uVar1 = *(ulong *)(local_18 + 0x180);
    _Var7 = std::pow<int,int>(0,0x77dad1);
    if ((uVar1 & (long)_Var7) != 0) {
      sprintf((char *)local_1218," [drop_prog] %s\n\r",
              *(undefined8 *)(*(long *)(local_18 + 0x178) + 0x48));
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
                   in_stack_ffffffffffffa4b8);
    }
    uVar1 = *(ulong *)(local_18 + 0x180);
    _Var7 = std::pow<int,int>(0,0x77db45);
    if ((uVar1 & (long)_Var7) != 0) {
      sprintf((char *)local_1218," [speech_prog] %s\n\r",
              *(undefined8 *)(*(long *)(local_18 + 0x178) + 0x50));
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
                   in_stack_ffffffffffffa4b8);
    }
    uVar1 = *(ulong *)(local_18 + 0x180);
    _Var7 = std::pow<int,int>(0,0x77dbb9);
    if ((uVar1 & (long)_Var7) != 0) {
      sprintf((char *)local_1218," [open_prog] %s\n\r",
              *(undefined8 *)(*(long *)(local_18 + 0x178) + 0x58));
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
                   in_stack_ffffffffffffa4b8);
    }
  }
  strcat(local_3618,"Characters: [");
  local_362d = '\0';
  for (local_3628 = *(long *)(local_18 + 0x18); local_3628 != 0;
      local_3628 = *(long *)(local_3628 + 8)) {
    one_argument((char *)in_stack_ffffffffffffa4b0,in_stack_ffffffffffffa4a8);
    strcat(local_3618,(char *)local_1218);
    strcat(local_3618," ");
    local_362d = '\x01';
  }
  if (local_362d == '\0') {
    strcat(local_3618,"none]\n\r");
  }
  else {
    sVar6 = strlen(local_3618);
    local_366c = (int)sVar6 + -1;
    local_3618[local_366c] = ']';
    strcat(local_3618,"\n\r");
  }
  strcat(local_3618,"Objects:    [");
  local_362d = '\0';
  for (local_3620 = *(long *)(local_18 + 0x20); local_3620 != 0;
      local_3620 = *(long *)(local_3620 + 8)) {
    one_argument((char *)in_stack_ffffffffffffa4b0,in_stack_ffffffffffffa4a8);
    strcat(local_3618,(char *)local_1218);
    strcat(local_3618," ");
    local_362d = '\x01';
  }
  if (local_362d == '\0') {
    strcat(local_3618,"none]\n\r");
  }
  else {
    sVar6 = strlen(local_3618);
    local_3670 = (int)sVar6 + -1;
    local_3618[local_3670] = ']';
    strcat(local_3618,"\n\r");
  }
  if (*(long *)(local_18 + 0x28) != 0) {
    for (local_3678 = *(undefined8 **)(local_18 + 0x28); local_3678 != (undefined8 *)0x0;
        local_3678 = (undefined8 *)*local_3678) {
      strcat(local_3618,"Extra Desc Keyword: ");
      strcat(local_3618,(char *)local_3678[2]);
      strcat(local_3618,"\n\r");
    }
  }
  for (local_362c = 0; local_362c < 6; local_362c = local_362c + 1) {
    local_3680 = *(long **)(local_18 + 0x38 + (long)local_362c * 8);
    if (local_3680 != (long *)0x0) {
      ppcVar8 = local_1218;
      flag_table = (flag_type *)capitalize(dir_name[local_362c]);
      if (*local_3680 == 0) {
        in_stack_ffffffffffffa4c4 = 0;
      }
      else {
        in_stack_ffffffffffffa4c4 = (uint)*(short *)(*local_3680 + 0x13a);
      }
      sprintf((char *)ppcVar8,"-%-5s to [%5d] Key: [%5d] ",flag_table,
              (ulong)in_stack_ffffffffffffa4c4,(ulong)(uint)(int)(short)local_3680[3]);
      strcat(local_3618,(char *)local_1218);
      flag_string(flag_table,(long *)ppcVar8);
      strcat(local_3618," Exit flags: [");
      while (one_argument((char *)in_stack_ffffffffffffa4b0,in_stack_ffffffffffffa4a8),
            local_4888[0] != '\0') {
        bVar2 = str_infix((char *)ppcVar8,
                          (char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0));
        if (bVar2) {
          sVar6 = strlen(local_4888);
          for (local_5a94 = 0; local_5a94 < (int)sVar6; local_5a94 = local_5a94 + 1) {
            if ((local_4888[local_5a94] < 'a') || ('z' < local_4888[local_5a94])) {
              in_stack_ffffffffffffa4c0 = (int)local_4888[local_5a94];
            }
            else {
              in_stack_ffffffffffffa4c0 = local_4888[local_5a94] + -0x20;
            }
            local_4888[local_5a94] = (char)in_stack_ffffffffffffa4c0;
          }
        }
        strcat(local_3618,local_4888);
        strcat(local_3618," ");
      }
      sVar6 = strlen(local_3618);
      local_3618[(int)sVar6 + -1] = ']';
      strcat(local_3618,"\n\r");
      if ((local_3680[4] != 0) && (*(char *)local_3680[4] != '\0')) {
        sprintf((char *)local_1218,"Kwds: [%s]\n\r",local_3680[4]);
        strcat(local_3618,(char *)local_1218);
      }
      if ((local_3680[5] != 0) && (*(char *)local_3680[5] != '\0')) {
        sprintf((char *)local_1218,"%s",local_3680[5]);
        strcat(local_3618,(char *)local_1218);
      }
    }
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
               in_stack_ffffffffffffa4b8);
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffa4c4,in_stack_ffffffffffffa4c0),
               in_stack_ffffffffffffa4b8);
  do_resets((CHAR_DATA *)word._4176_8_,(char *)word._4168_8_);
  return false;
}

Assistant:

bool redit_show(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;
	char buf[MAX_STRING_LENGTH];
	char buf1[2 * MAX_STRING_LENGTH];
	OBJ_DATA *obj;
	CHAR_DATA *rch;
	int door;
	bool fcnt;

	EDIT_ROOM(ch, pRoom);

	buf1[0] = '\0';

	sprintf(buf, "Description:\n\r%s", pRoom->description);
	strcat(buf1, buf);

	if (pRoom->alt_description)
	{
		sprintf(buf, "Alt Desc:\n\r%sAlternate Room Title is %s.\n\rDescription is %s.\n\r",
			pRoom->alt_description,
			pRoom->alt_name,
			altdesc_condtable[pRoom->alt_description_cond].display);
		strcat(buf1, buf);
	}
	else
		strcat(buf1, "Alt Desc:   [None]\n\r");

	sprintf(buf, "Name:       [%s]\n\rArea:       [%5d] %s\n\r",
		pRoom->name,
		pRoom->area->vnum,
		pRoom->area->name);
	strcat(buf1, buf);

	sprintf(buf, "Vnum:       [%5d]\n\rSector:     [%s]\n\r",
		pRoom->vnum,
		flag_string_old(sector_flags, pRoom->sector_type));
	strcat(buf1, buf);

	sprintf(buf, "Cabal:      [%s]\n\r", cabal_table[pRoom->cabal].name);
	strcat(buf1, buf);

	sprintf(buf, "Owner:      [%s]\n\r", (pRoom->owner) ? pRoom->owner : "None");
	strcat(buf1, buf);

	sprintf(buf, "Room flags: [%s]\n\r", flag_string(room_flags, pRoom->room_flags));
	strcat(buf1, buf);

	sprintf(buf, "Health recovery:[%d]\n\rMana recovery  :[%d]\n\r", pRoom->heal_rate, pRoom->mana_rate);
	strcat(buf1, buf);

	strcat(buf1, "Trap:");

	if (pRoom->trap)
	{
		auto buffer = 
			fmt::sprintf("\n\r Type:          [%s]\n\r Quality:       [%2d]\n\r Complexity:    [%3d]\n\r Timer:         [%d seconds]\n\r Trigger Echo:  [%s]\n\r Execute Echo:  [%s]\n\r",
				flag_name_lookup(pRoom->trap->type, trap_table),
				pRoom->trap->quality,
				pRoom->trap->complexity,
				pRoom->trap->timer,
				(pRoom->trap->trig_echo != nullptr) ? pRoom->trap->trig_echo : "None",
				(pRoom->trap->exec_echo != nullptr) ? pRoom->trap->exec_echo : "None"); //TODO: change the rest of the sprintf calls to format

		strcat(buf1, buffer.data());
	}
	else
	{
		strcat(buf1, "       [None]\n\r");
	}

	send_to_char(buf1, ch);
	buf1[0] = '\0';

	if (!IS_ZERO_VECTOR(pRoom->progtypes))
	{
		send_to_char("Room Programs:\n\r", ch);
		if (IS_SET(pRoom->progtypes, RPROG_PULSE))
		{
			sprintf(buf, " [pulse_prog] %s\n\r", pRoom->rprogs->pulse_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_ENTRY))
		{
			sprintf(buf, " [entry_prog] %s\n\r", pRoom->rprogs->entry_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_MOVE))
		{
			sprintf(buf, " [move_prog] %s\n\r", pRoom->rprogs->move_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_DROP))
		{
			sprintf(buf, " [drop_prog] %s\n\r", pRoom->rprogs->drop_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_SPEECH))
		{
			sprintf(buf, " [speech_prog] %s\n\r", pRoom->rprogs->speech_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_OPEN))
		{
			sprintf(buf, " [open_prog] %s\n\r", pRoom->rprogs->open_name);
			send_to_char(buf, ch);
		}
	}

	strcat(buf1, "Characters: [");
	fcnt = false;

	for (rch = pRoom->people; rch; rch = rch->next_in_room)
	{
		one_argument(rch->name, buf);
		strcat(buf1, buf);
		strcat(buf1, " ");
		fcnt = true;
	}

	if (fcnt)
	{
		int end = strlen(buf1) - 1;
		buf1[end] = ']';
		strcat(buf1, "\n\r");
	}
	else
	{
		strcat(buf1, "none]\n\r");
	}

	strcat(buf1, "Objects:    [");
	fcnt = false;

	for (obj = pRoom->contents; obj; obj = obj->next_content)
	{
		one_argument(obj->name, buf);
		strcat(buf1, buf);
		strcat(buf1, " ");
		fcnt = true;
	}

	if (fcnt)
	{
		int end = strlen(buf1) - 1;
		buf1[end] = ']';
		strcat(buf1, "\n\r");
	}
	else
	{
		strcat(buf1, "none]\n\r");
	}

	if (pRoom->extra_descr)
	{
		for (EXTRA_DESCR_DATA *ed = pRoom->extra_descr; ed; ed = ed->next)
		{
			strcat(buf1, "Extra Desc Keyword: ");
			strcat(buf1, ed->keyword);
			strcat(buf1, "\n\r");
		}
	}

	for (door = 0; door < MAX_DIR; door++)
	{
		EXIT_DATA *pexit = pRoom->exit[door];

		if (pexit != nullptr)
		{
			char word[MAX_INPUT_LENGTH];
			char reset_state[MAX_STRING_LENGTH];
			char *state;
			int i, length;

			sprintf(buf, "-%-5s to [%5d] Key: [%5d] ",
				capitalize(dir_name[door]),
				pexit->u1.to_room ? pexit->u1.to_room->vnum : 0, /* ROM OLC */
				pexit->key);
			strcat(buf1, buf);

			/*
			 * Format up the exit info.
			 * Capitalize all flags that are not part of the reset info.
			 */
			state = flag_string(exit_flags, pexit->exit_info);
			strcat(buf1, " Exit flags: [");

			for (;;)
			{
				state = one_argument(state, word);

				if (word[0] == '\0')
				{
					int end = strlen(buf1) - 1;
					buf1[end] = ']';
					strcat(buf1, "\n\r");
					break;
				}

				if (str_infix(word, reset_state))
				{
					length = strlen(word);

					for (i = 0; i < length; i++)
					{
						word[i] = UPPER(word[i]);
					}
				}

				strcat(buf1, word);
				strcat(buf1, " ");
			}

			if (pexit->keyword && pexit->keyword[0] != '\0')
			{
				sprintf(buf, "Kwds: [%s]\n\r", pexit->keyword);
				strcat(buf1, buf);
			}

			if (pexit->description && pexit->description[0] != '\0')
			{
				sprintf(buf, "%s", pexit->description);
				strcat(buf1, buf);
			}
		}
	}

	send_to_char(buf1, ch);
	send_to_char("Syntax:  resets\n\r---- RESETS ----\n\r", ch);
	do_resets(ch, "");
	return false;
}